

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate_p.h
# Opt level: O2

void __thiscall
QNonContiguousByteDeviceThreadForwardImpl::QNonContiguousByteDeviceThreadForwardImpl
          (QNonContiguousByteDeviceThreadForwardImpl *this,bool aE,qint64 s)

{
  QNonContiguousByteDevice::QNonContiguousByteDevice((QNonContiguousByteDevice *)this);
  *(undefined ***)this = &PTR_metaObject_002cdf48;
  this[0x10] = (QNonContiguousByteDeviceThreadForwardImpl)0x0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  this[0x40] = (QNonContiguousByteDeviceThreadForwardImpl)aE;
  *(qint64 *)(this + 0x48) = s;
  *(undefined8 *)(this + 0x50) = 0;
  return;
}

Assistant:

QNonContiguousByteDeviceThreadForwardImpl(bool aE, qint64 s)
        : QNonContiguousByteDevice(),
          m_atEnd(aE),
          m_size(s)
    {
    }